

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O2

string * prometheus::detail::base64url_encode(string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  
  base64_encode(__return_storage_ptr__,input);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,prometheus::detail::base64url_encode(std::__cxx11::string_const&)::_lambda(char)_1_>
            (pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string base64url_encode(const std::string& input) {
  std::string s = base64_encode(input);
  std::transform(begin(s), end(s), begin(s), [](char c) {
    if (c == '+') return '-';
    if (c == '/') return '_';
    return c;
  });
  return s;
}